

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

string * __thiscall
spvtools::val::Instruction::GetOperandAs<std::__cxx11::string>
          (string *__return_storage_ptr__,Instruction *this,size_t index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint *puVar2;
  ushort uVar3;
  uint uVar4;
  pointer psVar5;
  pointer pcVar6;
  bool bVar7;
  ulong uVar8;
  byte bVar9;
  uint *puVar10;
  bool bVar11;
  bool bVar12;
  
  psVar5 = (this->operands_).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)(this->operands_).
                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4;
  if (index < uVar8) {
    uVar3 = psVar5[index].num_words;
    if ((uint)uVar3 + (uint)psVar5[index].offset <= (uint)(this->inst_).num_words) {
      puVar10 = (this->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start + psVar5[index].offset;
      paVar1 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      bVar12 = (ulong)uVar3 == 0;
      if (bVar12) {
        bVar7 = false;
      }
      else {
        puVar2 = puVar10 + uVar3;
        bVar7 = false;
        do {
          uVar4 = *puVar10;
          bVar9 = 0;
          bVar11 = false;
          uVar8 = 0;
          do {
            if ((char)(uVar4 >> (bVar9 & 0x1f)) == '\0') {
              bVar7 = true;
              break;
            }
            std::__cxx11::string::push_back((char)__return_storage_ptr__);
            bVar11 = 2 < uVar8;
            uVar8 = uVar8 + 1;
            bVar9 = bVar9 + 8;
          } while (uVar8 != 4);
          if (!bVar11) break;
          puVar10 = puVar10 + 1;
          bVar12 = puVar10 == puVar2;
        } while (!bVar12);
      }
      if (!bVar12) {
        if ((!bVar7) &&
           (pcVar6 = (__return_storage_ptr__->_M_dataplus)._M_p,
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)pcVar6 != paVar1)) {
          operator_delete(pcVar6,paVar1->_M_allocated_capacity + 1);
        }
        return __return_storage_ptr__;
      }
      __assert_fail("!assert_found_terminating_null && \"Did not find terminating null for the string.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/string_utils.h"
                    ,0x65,
                    "std::string spvtools::utils::MakeString(InputIt, InputIt, bool) [InputIt = const unsigned int *]"
                   );
    }
  }
  else {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",index,
               uVar8);
  }
  __assert_fail("o.offset + o.num_words <= inst_.num_words",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/instruction.cpp"
                ,0x32,"std::string spvtools::val::Instruction::GetOperandAs(size_t) const");
}

Assistant:

std::string Instruction::GetOperandAs<std::string>(size_t index) const {
  const spv_parsed_operand_t& o = operands_.at(index);
  assert(o.offset + o.num_words <= inst_.num_words);
  return spvtools::utils::MakeString(words_.data() + o.offset, o.num_words);
}